

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O1

size_t ZSTD_fseBitCost(FSE_CTable *ctable,uint *count,uint max)

{
  ushort uVar1;
  byte bVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  U32 tableSize;
  long lVar8;
  ulong uVar9;
  
  uVar1 = (ushort)*ctable;
  bVar2 = (byte)uVar1;
  lVar8 = 1;
  if (uVar1 != 0) {
    lVar8 = (long)(1 << (bVar2 - 1 & 0x1f));
  }
  sVar4 = 0xffffffffffffffff;
  if (max <= *(ushort *)((long)ctable + 2)) {
    uVar5 = 0;
    uVar9 = 0;
    do {
      iVar6 = (ctable[lVar8 + uVar5 * 2 + 2] >> 0x10) + 1;
      if ((ulong)count[uVar5] == 0) {
        bVar3 = false;
      }
      else {
        uVar7 = iVar6 * 0x100 -
                (iVar6 * 0x1000000 +
                 (ctable[lVar8 + uVar5 * 2 + 2] + (1 << (bVar2 & 0x1f))) * -0x100 >> (bVar2 & 0x1f))
        ;
        bVar3 = true;
        if (uVar7 < (uint)uVar1 * 0x100 + 0x100) {
          uVar9 = uVar9 + (ulong)uVar7 * (ulong)count[uVar5];
          bVar3 = false;
        }
      }
      if (bVar3) {
        return 0xffffffffffffffff;
      }
      uVar5 = uVar5 + 1;
    } while (max + 1 != uVar5);
    sVar4 = uVar9 >> 8;
  }
  return sVar4;
}

Assistant:

MEM_STATIC U16 MEM_read16(const void* ptr) { return ((const unalign16*)ptr)->v; }